

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.cpp
# Opt level: O2

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  char cVar1;
  uint uVar2;
  void *pvVar3;
  GCObject *pGVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  TValue *i_o;
  char *pcVar8;
  StkId pTVar9;
  GCObject *t;
  global_State *pgVar10;
  TValue *pTVar11;
  uint uVar12;
  char *pcVar13;
  long lVar14;
  GCObject *pGVar15;
  char *source;
  CallInfo *ci;
  int local_54;
  char *local_50;
  
  local_54 = 1;
  if (*what == '>') {
    pTVar9 = L->top;
    if (pTVar9[-1].tt != 6) {
      __assert_fail("(((func)->tt) == 6)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cuberite[P]lua/src/ldebug.cpp"
                    ,0xef,"int lua_getinfo(lua_State *, const char *, lua_Debug *)");
    }
    local_50 = what + 1;
    pGVar15 = pTVar9[-1].value.gc;
    L->top = pTVar9 + -1;
    ci = (CallInfo *)0x0;
LAB_001092a5:
    if (pGVar15 != (GCObject *)0x0) {
      local_54 = 1;
      pcVar13 = local_50;
      do {
        cVar1 = *pcVar13;
        if (cVar1 != 'L') {
          if (cVar1 == 'S') {
            if ((pGVar15->h).flags == '\0') {
              source = (char *)&(((pGVar15->th).l_G)->grayagain->h).array;
              ar->source = source;
              iVar6 = (int)(((pGVar15->th).l_G)->buff).n;
              ar->linedefined = iVar6;
              iVar7 = *(int *)((long)&(((pGVar15->th).l_G)->buff).n + 4);
              pcVar8 = "Lua";
              if (iVar6 == 0) {
                pcVar8 = "main";
              }
            }
            else {
              source = "=[C]";
              ar->source = "=[C]";
              ar->linedefined = -1;
              iVar7 = -1;
              pcVar8 = "C";
            }
            ar->lastlinedefined = iVar7;
            ar->what = pcVar8;
            luaO_chunkid(ar->short_src,source,0x3c);
          }
          else if (cVar1 != 'f') {
            if (cVar1 == 'l') {
              iVar6 = -1;
              if (ci != (CallInfo *)0x0) {
                iVar6 = currentline(L,ci);
              }
              ar->currentline = iVar6;
            }
            else if (cVar1 == 'n') {
              if ((ci != (CallInfo *)0x0) &&
                 ((((ci->func->tt != 6 || ((((ci->func->value).gc)->h).flags != '\0')) ||
                   (ci->tailcalls < 1)) &&
                  (((ci[-1].func)->tt == 6 &&
                   (pGVar4 = ((ci[-1].func)->value).gc, (pGVar4->h).flags == '\0')))))) {
                pvVar3 = ((pGVar4->th).l_G)->ud;
                iVar6 = currentpc(L,ci + -1);
                uVar2 = *(uint *)((long)pvVar3 + (long)iVar6 * 4);
                uVar12 = uVar2 & 0x3f;
                if ((uVar12 < 0x22) && ((0x230000000U >> uVar12 & 1) != 0)) {
                  pcVar8 = getobjname(L,ci + -1,uVar2 >> 6 & 0xff,&ar->name);
                  ar->namewhat = pcVar8;
                  if (pcVar8 != (char *)0x0) goto LAB_0010947d;
                }
              }
              ar->namewhat = "";
              ar->name = (char *)0x0;
            }
            else if (cVar1 == 'u') {
              ar->nups = (uint)(pGVar15->h).lsizenode;
            }
            else {
              if (cVar1 == '\0') goto LAB_00109485;
              local_54 = 0;
            }
          }
        }
LAB_0010947d:
        pcVar13 = pcVar13 + 1;
      } while( true );
    }
  }
  else {
    lVar14 = (long)ar->i_ci;
    local_50 = what;
    if (lVar14 != 0) {
      ci = L->base_ci + lVar14;
      pGVar15 = ((L->base_ci[lVar14].func)->value).gc;
      goto LAB_001092a5;
    }
  }
  ar->namewhat = "";
  ar->name = "";
  ar->what = "tail";
  ar->currentline = -1;
  ar->linedefined = -1;
  ar->lastlinedefined = -1;
  ar->source = "=(tail call)";
  luaO_chunkid(ar->short_src,"=(tail call)",0x3c);
  ar->nups = 0;
  bVar5 = true;
  pGVar15 = (GCObject *)0x0;
LAB_001094df:
  pcVar13 = strchr(local_50,0x66);
  if (pcVar13 != (char *)0x0) {
    pTVar9 = L->top;
    if (bVar5) {
      pTVar9->tt = 0;
    }
    else {
      (pTVar9->value).gc = pGVar15;
      pTVar9->tt = 6;
      pTVar9 = L->top;
    }
    if ((long)L->stack_last - (long)pTVar9 < 0x11) {
      luaD_growstack(L,1);
    }
    L->top = L->top + 1;
  }
  pcVar13 = strchr(local_50,0x4c);
  if (pcVar13 != (char *)0x0) {
    if ((bVar5) || ((pGVar15->h).flags != '\0')) {
      pTVar9 = L->top;
      pTVar9->tt = 0;
    }
    else {
      t = (GCObject *)luaH_new(L,0,0);
      pgVar10 = (pGVar15->th).l_G;
      pGVar4 = pgVar10->rootgc;
      for (lVar14 = 0; lVar14 < *(int *)((long)&pgVar10->tmudata + 4); lVar14 = lVar14 + 1) {
        pTVar11 = luaH_setnum(L,&t->h,*(int *)((long)pGVar4 + lVar14 * 4));
        (pTVar11->value).b = 1;
        pTVar11->tt = 1;
        pgVar10 = (pGVar15->th).l_G;
      }
      pTVar9 = L->top;
      (pTVar9->value).gc = t;
      pTVar9->tt = 5;
      pTVar9 = L->top;
    }
    if ((long)L->stack_last - (long)pTVar9 < 0x11) {
      luaD_growstack(L,1);
      pTVar9 = L->top;
    }
    L->top = pTVar9 + 1;
  }
  return local_54;
LAB_00109485:
  bVar5 = false;
  goto LAB_001094df;
}

Assistant:

LUA_API int lua_getinfo (lua_State *L, const char *what, lua_Debug *ar) {
  int status;
  Closure *f = NULL;
  CallInfo *ci = NULL;
  lua_lock(L);
  if (*what == '>') {
    StkId func = L->top - 1;
    luai_apicheck(L, ttisfunction(func));
    what++;  /* skip the '>' */
    f = clvalue(func);
    L->top--;  /* pop function */
  }
  else if (ar->i_ci != 0) {  /* no tail call? */
    ci = L->base_ci + ar->i_ci;
    lua_assert(ttisfunction(ci->func));
    f = clvalue(ci->func);
  }
  status = auxgetinfo(L, what, ar, f, ci);
  if (strchr(what, 'f')) {
    if (f == NULL) setnilvalue(L->top);
    else setclvalue(L, L->top, f);
    incr_top(L);
  }
  if (strchr(what, 'L'))
    collectvalidlines(L, f);
  lua_unlock(L);
  return status;
}